

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

size_t Catch::listTags(Config *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  tuple<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar6;
  undefined4 extraout_var_00;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  iterator iVar7;
  size_t *psVar8;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar9;
  size_t sVar10;
  ostream *poVar11;
  _Base_ptr p_Var12;
  long lVar13;
  string *s;
  char *pcVar14;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_bool>
  pVar15;
  string lcaseTagName;
  Column wrapper;
  ReusableStringStream rss;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  tagCounts;
  undefined1 local_178 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  size_t local_148;
  string local_138;
  undefined1 local_118 [8];
  _Alloc_hider local_110;
  char local_108 [8];
  undefined1 local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_d8;
  size_t local_d0;
  size_t local_c8;
  pointer local_c0;
  pointer local_b8;
  ReusableStringStream local_b0;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  local_80;
  string local_50;
  
  iVar4 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
  iVar5 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xe])(config);
  if ((char)iVar5 == '\0') {
    pcVar14 = "All available tags:\n";
    lVar13 = 0x14;
  }
  else {
    pcVar14 = "Tags for matching test cases:\n";
    lVar13 = 0x1e;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar14,lVar13);
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  pSVar6 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar5 = (*(pSVar6->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar6);
  testCases = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x18))
                        ((long *)CONCAT44(extraout_var_00,iVar5),config);
  filterTests(&local_98,testCases,(TestSpec *)CONCAT44(extraout_var,iVar4),&config->super_IConfig);
  local_c0 = local_98.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_98.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_98.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_178 + 8);
    do {
      psVar2 = ((local_98.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                 _M_impl.super__Vector_impl_data._M_start)->super_TestCaseInfo).tags.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_b8 = local_98.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      for (s = ((local_98.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                 _M_impl.super__Vector_impl_data._M_start)->super_TestCaseInfo).tags.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; s != psVar2; s = s + 1) {
        toLower(&local_138,s);
        iVar7 = clara::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                ::find(&local_80,&local_138);
        if ((_Rb_tree_header *)iVar7._M_node == &local_80._M_impl.super__Rb_tree_header) {
          local_168._M_dataplus._M_p = (pointer)0x0;
          local_178._0_8_ = (pointer)0x0;
          local_178._8_8_ = (pointer)0x0;
          local_168.field_2._8_8_ = 0;
          local_148 = 0;
          local_118 = (undefined1  [8])local_108;
          local_168._M_string_length = (size_type)paVar1;
          local_168.field_2._M_allocated_capacity = (size_type)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_118,
                     CONCAT71(local_138._M_dataplus._M_p._1_7_,local_138._M_dataplus._M_p._0_1_),
                     local_138._M_string_length +
                     CONCAT71(local_138._M_dataplus._M_p._1_7_,local_138._M_dataplus._M_p._0_1_));
          if ((_Base_ptr)local_168._M_dataplus._M_p == (_Base_ptr)0x0) {
            local_f0._M_allocated_capacity =
                 (ulong)(uint)local_f0._M_allocated_capacity._4_4_ << 0x20;
            local_f0._8_8_ = (_Base_ptr)0x0;
            local_e0 = &local_f0;
            psVar8 = &local_d0;
            paStack_d8 = local_e0;
          }
          else {
            local_f0._M_allocated_capacity._0_4_ = local_178._8_4_;
            local_f0._8_8_ = local_168._M_dataplus._M_p;
            local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_168._M_string_length;
            paStack_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_168.field_2._M_allocated_capacity;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)(local_168._M_dataplus._M_p + 8) = &local_f0;
            local_d0 = local_168.field_2._8_8_;
            local_168._M_dataplus._M_p = (pointer)0x0;
            psVar8 = (size_t *)((long)&local_168.field_2 + 8);
            local_168._M_string_length = (size_type)paVar1;
            local_168.field_2._M_allocated_capacity = (size_type)paVar1;
          }
          *psVar8 = 0;
          local_c8 = local_148;
          pVar15 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                   ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::TagInfo>>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                               *)&local_80,
                              (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                               *)local_118);
          iVar7._M_node = (_Base_ptr)pVar15.first._M_node;
          clara::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_100 + 8));
          if (local_118 != (undefined1  [8])local_108) {
            operator_delete((void *)local_118);
          }
          clara::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_178);
        }
        iVar7._M_node[3]._M_left = (_Base_ptr)((long)&(iVar7._M_node[3]._M_left)->_M_color + 1);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)(iVar7._M_node + 2),s);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_138._M_dataplus._M_p._1_7_,local_138._M_dataplus._M_p._0_1_) !=
            &local_138.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_138._M_dataplus._M_p._1_7_,local_138._M_dataplus._M_p._0_1_
                                  ));
        }
      }
      local_98.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start = local_b8 + 1;
    } while (local_98.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
             super__Vector_impl_data._M_start != local_c0);
  }
  if ((_Rb_tree_header *)local_80._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_80._M_impl.super__Rb_tree_header) {
    p_Var12 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_b0.super_NonCopyable._vptr_NonCopyable =
           (_func_int **)&PTR__ReusableStringStream_001993a8;
      pSVar9 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
               getInternal();
      sVar10 = StringStreams::add(&pSVar9->super_StringStreams);
      local_b0.m_index = sVar10;
      pSVar9 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
               getInternal();
      tVar3.
      super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           *(_Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&(pSVar9->super_StringStreams).m_streams.
                super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[sVar10]._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      local_b0.m_oss =
           (ostream *)
           tVar3.
           super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 tVar3.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl,"  ",2);
      *(undefined8 *)
       ((long)tVar3.
              super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl +
       *(long *)(*(long *)tVar3.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + -0x18) + 0x10) = 2;
      std::ostream::_M_insert<unsigned_long>
                ((ulong)tVar3.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 tVar3.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl,"  ",2);
      std::__cxx11::stringbuf::str();
      TagInfo::all_abi_cxx11_(&local_50,(TagInfo *)(p_Var12 + 2));
      clara::TextFlow::Column::Column((Column *)local_178,&local_50);
      local_168.field_2._8_8_ = 0;
      local_168.field_2._M_allocated_capacity = local_138._M_string_length;
      local_168._M_string_length = 0x46;
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_118,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_178);
      local_f0._M_allocated_capacity = local_168.field_2._8_8_;
      local_100._0_8_ = local_168._M_string_length;
      local_100._8_8_ = local_168.field_2._M_allocated_capacity;
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           (char *)CONCAT71(local_138._M_dataplus._M_p._1_7_,
                                            local_138._M_dataplus._M_p._0_1_),
                           local_138._M_string_length);
      poVar11 = clara::TextFlow::operator<<(poVar11,(Column *)local_118);
      local_178[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_178,1);
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_138._M_dataplus._M_p._1_7_,local_138._M_dataplus._M_p._0_1_) !=
          &local_138.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_138._M_dataplus._M_p._1_7_,local_138._M_dataplus._M_p._0_1_))
        ;
      }
      ReusableStringStream::~ReusableStringStream(&local_b0);
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != &local_80._M_impl.super__Rb_tree_header);
  }
  sVar10 = local_80._M_impl.super__Rb_tree_header._M_node_count;
  local_178._0_8_ = &local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"tag","");
  local_118 = (undefined1  [8])sVar10;
  local_110._M_p = (pointer)local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,local_178._0_8_,
             (long)&((_Alloc_hider *)local_178._8_8_)->_M_p + local_178._0_8_);
  operator<<((ostream *)&std::cout,(pluralise *)local_118);
  local_138._M_dataplus._M_p._0_1_ = 10;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)&local_138,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  if ((pointer)local_110._M_p != (pointer)local_100) {
    operator_delete(local_110._M_p);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_ !=
      &local_168) {
    operator_delete((void *)local_178._0_8_);
  }
  sVar10 = local_80._M_impl.super__Rb_tree_header._M_node_count;
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_98);
  clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::~_Rb_tree(&local_80);
  return (size_t)(pointer)sVar10;
}

Assistant:

std::size_t listTags( Config const& config ) {
        TestSpec const& testSpec = config.testSpec();
        if( config.hasTestFilters() )
            Catch::cout() << "Tags for matching test cases:\n";
        else {
            Catch::cout() << "All available tags:\n";
        }

        std::map<std::string, TagInfo> tagCounts;

        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( auto const& testCase : matchedTestCases ) {
            for( auto const& tagName : testCase.getTestCaseInfo().tags ) {
                std::string lcaseTagName = toLower( tagName );
                auto countIt = tagCounts.find( lcaseTagName );
                if( countIt == tagCounts.end() )
                    countIt = tagCounts.insert( std::make_pair( lcaseTagName, TagInfo() ) ).first;
                countIt->second.add( tagName );
            }
        }

        for( auto const& tagCount : tagCounts ) {
            ReusableStringStream rss;
            rss << "  " << std::setw(2) << tagCount.second.count << "  ";
            auto str = rss.str();
            auto wrapper = Column( tagCount.second.all() )
                                                    .initialIndent( 0 )
                                                    .indent( str.size() )
                                                    .width( CATCH_CONFIG_CONSOLE_WIDTH-10 );
            Catch::cout() << str << wrapper << '\n';
        }
        Catch::cout() << pluralise( tagCounts.size(), "tag" ) << '\n' << std::endl;
        return tagCounts.size();
    }